

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_node_copy_cstr(mpack_node_t node,char *buffer,size_t bufsize)

{
  char *pcVar1;
  mpack_node_data_t *pmVar2;
  _Bool _Var3;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar4;
  ulong bytes;
  mpack_error_t mStack_30;
  
  tree = node.tree;
  pmVar4 = node.data;
  if (tree->error != mpack_ok) {
    *buffer = '\0';
    return;
  }
  if (pmVar4->type == mpack_type_str) {
    bytes = (ulong)pmVar4->len;
    if (bufsize - 1 < bytes) {
      *buffer = '\0';
      mStack_30 = mpack_error_too_big;
      goto LAB_00107eb1;
    }
    pcVar1 = tree->data;
    pmVar2 = (pmVar4->value).children;
    _Var3 = mpack_str_check_no_null(pcVar1 + (long)pmVar2,bytes);
    if (_Var3) {
      memcpy(buffer,pcVar1 + (long)pmVar2,bytes);
      buffer[pmVar4->len] = '\0';
      return;
    }
  }
  *buffer = '\0';
  mStack_30 = mpack_error_type;
LAB_00107eb1:
  mpack_tree_flag_error(tree,mStack_30);
  return;
}

Assistant:

void mpack_node_copy_cstr(mpack_node_t node, char* buffer, size_t bufsize) {

    // we can't break here because the error isn't recoverable; we
    // have to add a null-terminator.
    mpack_assert(buffer != NULL, "buffer is NULL");
    mpack_assert(bufsize >= 1, "buffer size is zero; you must have room for at least a null-terminator");

    if (mpack_node_error(node) != mpack_ok) {
        buffer[0] = '\0';
        return;
    }

    if (node.data->type != mpack_type_str) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    if (node.data->len > bufsize - 1) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_too_big);
        return;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    buffer[node.data->len] = '\0';
}